

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O3

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::clock_phase
          (fm_operator<ymfm::opn_registers_base<false>_> *this,int32_t lfo_raw_pm)

{
  uint uVar1;
  
  uVar1 = (this->m_cache).phase_step;
  if (uVar1 == 1) {
    uVar1 = (this->m_cache).block_freq;
    uVar1 = ((((uVar1 * 2 & 0xffe) << ((byte)(uVar1 >> 0xb) & 7)) >> 2) + (this->m_cache).detune &
            0x1ffff) * (this->m_cache).multiple >> 1;
  }
  this->m_phase = this->m_phase + uVar1;
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_phase(int32_t lfo_raw_pm)
{
	// read from the cache, or recalculate if PM active
	uint32_t phase_step = m_cache.phase_step;
	if (phase_step == opdata_cache::PHASE_STEP_DYNAMIC)
		phase_step = m_regs.compute_phase_step(m_choffs, m_opoffs, m_cache, lfo_raw_pm);

	// finally apply the step to the current phase value
	m_phase += phase_step;
}